

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

string * wabt::anon_unknown_0::CWriter::Deref(string *__return_storage_ptr__,string *s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"(*",s);
  std::operator+(__return_storage_ptr__,&local_30,")");
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

std::string CWriter::Deref(const std::string& s) {
  return "(*" + s + ")";
}